

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  pair<int,_int> pVar2;
  istream *piVar3;
  ulong uVar4;
  pointer piVar5;
  long *plVar6;
  ostream *poVar7;
  pointer piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int l;
  int temp_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> liblist;
  int d;
  int b;
  int shiplimit;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bkList;
  vector<int,_std::allocator<int>_> booksScores;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mp;
  int local_f4;
  pair<int,_int> local_f0;
  pair<int,_int> *local_e8;
  iterator iStack_e0;
  pair<int,_int> *local_d8;
  int local_d0;
  int local_cc;
  value_type local_c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  void *local_88;
  iterator iStack_80;
  int *local_78;
  undefined1 local_68 [8];
  int *piStack_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  size_t local_40;
  
  iVar10 = 0;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x272b1c0) = 0;
  *(undefined8 *)(*(long *)(std::cout + -0x18) + 0x272b178) = 0;
  freopen("/mnt/sda3/Programming-Problem-Solutions/HashCode_2020/OnlineQualificationRound/a_example.txt"
          ,"r",_stdin);
  freopen("/mnt/sda3/Programming-Problem-Solutions/HashCode_2020/OnlineQualificationRound/a_example_output.txt"
          ,"w",_stdout);
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_cc);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_f4);
  std::istream::operator>>(piVar3,&local_d0);
  local_78 = (int *)0x0;
  local_88 = (void *)0x0;
  iStack_80._M_current = (int *)0x0;
  if (0 < local_cc) {
    do {
      std::istream::operator>>((istream *)&std::cin,(int *)local_68);
      if (iStack_80._M_current == local_78) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_88,iStack_80,(int *)local_68);
      }
      else {
        *iStack_80._M_current = local_68._0_4_;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < local_cc);
  }
  uVar4 = (ulong)local_f4;
  if (0 < (long)uVar4) {
    lVar12 = 0;
    do {
      piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_e8);
      piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)&local_a8);
      std::istream::operator>>(piVar3,(int *)&local_c8);
      local_68 = (undefined1  [8])0x0;
      piStack_60 = (int *)0x0;
      local_58 = (_Base_ptr)0x0;
      if (0 < (int)local_e8) {
        iVar10 = 0;
        do {
          std::istream::operator>>((istream *)&std::cin,&local_f0.first);
          if ((_Base_ptr)piStack_60 == local_58) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_68,(iterator)piStack_60,
                       &local_f0.first);
          }
          else {
            *piStack_60 = local_f0.first;
            piStack_60 = piStack_60 + 1;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)local_e8);
      }
      libraries[lVar12].libraryNo = (int)lVar12;
      libraries[lVar12].noOfBooks = (int)local_e8;
      libraries[lVar12].signupProcess =
           (int)local_a8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      libraries[lVar12].shipTime =
           (int)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::vector<int,_std::allocator<int>_>::operator=
                (&libraries[lVar12].booksList,(vector<int,_std::allocator<int>_> *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68);
      }
      lVar12 = lVar12 + 1;
      uVar4 = (ulong)local_f4;
    } while (lVar12 < (long)uVar4);
  }
  lVar12 = 0;
  if (local_f4 == 0) {
    bVar1 = false;
  }
  else {
    lVar11 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::__introsort_loop<library*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(library,library)>>
              (libraries,libraries + uVar4,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(library,_library)>)0x101376);
    std::
    __final_insertion_sort<library*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(library,library)>>
              (libraries,libraries + uVar4,(_Iter_comp_iter<bool_(*)(library,_library)>)0x101376);
    bVar1 = 0 < local_f4;
  }
  local_50 = (_Base_ptr)&piStack_60;
  piStack_60 = (int *)((ulong)piStack_60 & 0xffffffff00000000);
  local_58 = (_Base_ptr)0x0;
  local_40 = 0;
  local_d8 = (pair<int,_int> *)0x0;
  local_e8 = (pair<int,_int> *)0x0;
  iStack_e0._M_current = (pair<int,_int> *)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = local_50;
  if (bVar1) {
    lVar12 = 0;
    iVar10 = local_d0;
    do {
      iVar10 = iVar10 - libraries[lVar12].signupProcess;
      if (iVar10 < 0) break;
      uVar4 = (long)libraries[lVar12].booksList.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)libraries[lVar12].booksList.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      iVar13 = libraries[lVar12].shipTime;
      iVar9 = ((int)(uVar4 / (ulong)(long)iVar13) + 1) - (uint)(uVar4 % (ulong)(long)iVar13 == 0);
      if (iVar10 <= iVar9) {
        iVar9 = iVar10;
      }
      iVar9 = iVar9 * iVar13;
      local_f0.first = libraries[lVar12].libraryNo;
      local_f0.second = iVar9;
      if (iStack_e0._M_current == local_d8) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_e8,
                   iStack_e0,&local_f0);
      }
      else {
        pVar2.second = iVar9;
        pVar2.first = local_f0.first;
        *iStack_e0._M_current = pVar2;
        iStack_e0._M_current = iStack_e0._M_current + 1;
      }
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      piVar5 = libraries[lVar12].booksList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = libraries[lVar12].booksList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((piVar8 != piVar5) && (0 < iVar9)) {
        lVar11 = 0;
        uVar4 = 1;
        do {
          if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)((long)piVar5 + lVar11));
            piVar5 = libraries[lVar12].booksList.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar8 = libraries[lVar12].booksList.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = *(int *)((long)piVar5 + lVar11);
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if ((ulong)((long)piVar8 - (long)piVar5 >> 2) <= uVar4) break;
          lVar11 = lVar11 + 4;
          iVar13 = (int)uVar4;
          uVar4 = uVar4 + 1;
        } while (iVar13 < iVar9);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&local_a8,&local_c8);
      if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < local_f4);
  }
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar12);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if (iStack_e0._M_current != local_e8) {
    uVar4 = 0;
    do {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_e8[uVar4].first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      piVar5 = local_a8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (local_a8.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar4].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
          piVar5) {
        uVar14 = 0;
        do {
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar5[uVar14]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          uVar14 = uVar14 + 1;
          piVar5 = local_a8.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        } while (uVar14 < (ulong)((long)local_a8.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)iStack_e0._M_current - (long)local_e8 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  fclose(_stdin);
  fclose(_stdout);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a8);
  if (local_e8 != (pair<int,_int> *)0x0) {
    operator_delete(local_e8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_68);
  if (local_88 != (void *)0x0) {
    operator_delete(local_88);
  }
  return 0;
}

Assistant:

int main()
{
    sync;
    inputa;
    outputa;
   /* inputb;
    outputb;
    inputc;
    outputc;
   inputd;
    outputd;
    inpute;
    outpute;
   inputf;
    outputf;*/

    int b, l, d;
    cin>>b>>l>>d;

    vector<int> booksScores;
    for(int i=0;i<b;i++)
    {
        int temp;
        cin>>temp;
        booksScores.push_back(temp);
    }
    for(int i=0;i<l;i++)
    {
        int bk, stime,shiplimit;
        cin>>bk>>stime>>shiplimit;
        vector<int> lists;
        for(int j=0;j<bk;j++)
        {
            int temp;
            cin>>temp;
            lists.push_back(temp);
        }
        libraries[i].libraryNo = i;
        libraries[i].noOfBooks= bk;
        libraries[i].signupProcess = stime;
        libraries[i].shipTime = shiplimit;
        libraries[i].booksList=lists;
    }
    sort(libraries, libraries+l, compareTwoLibrary);
    int time = d;
    int totalLibrary = 0;
    map<int,int> mp;
    vector<pair<int,int>> liblist;
    vector<vector<int>> bkList;
    for(int i=0;i<l;i++)
    {
        if(time - libraries[i].signupProcess >= 0)
            time -= libraries[i].signupProcess;
        else break;

        totalLibrary++;
        int noCanbetaken = 0;
        int tempdays = libraries[i].booksList.size() / libraries[i].shipTime;
        if (libraries[i].booksList.size() % libraries[i].shipTime !=0)
            tempdays += 1;
        if(tempdays > time)
        {
            noCanbetaken = time * libraries[i].shipTime;
        } else
        {
            noCanbetaken =((tempdays) * libraries[i].shipTime);
        }
        pair<int,int> tp;
        tp.first = libraries[i].libraryNo;
        tp.second = noCanbetaken;
        liblist.push_back(tp);
        int cnt = 0;
        vector<int> lt;
        for(int j=0;j<libraries[i].booksList.size();j++,cnt++)
        {
            if(cnt >= noCanbetaken) break;
            /*if(mp[libraries[i].booksList[j]] == 0)
            {
                mp[libraries[i].booksList[j]] = 1;

            }*/
            lt.push_back(libraries[i].booksList[j]);
        }
        bkList.push_back(lt);

    }
    cout<<totalLibrary<<endl;
    for(int i=0;i<liblist.size();i++)
    {
        cout<<liblist[i].first<<" "<<bkList[i].size()<<endl;
        for(int j=0;j<bkList[i].size();j++)
        {
            cout<<bkList[i][j]<<" ";
        }
        cout<<endl;
    }
    cout<<endl;
    fclose(stdin);
    fclose(stdout);
    return 0;
}